

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qloggingregistry.cpp
# Opt level: O1

QLoggingCategory * QLoggingRegistry::defaultCategory(void)

{
  instance();
  return (QLoggingCategory *)defaultLoggingCategory;
}

Assistant:

QLoggingCategory *QLoggingRegistry::defaultCategory()
{
    // Initialize the defaultLoggingCategory global static, if necessary. Note
    // how it remains initialized forever, even if the QLoggingRegistry
    // instance() is destroyed.
    instance();

    // std::launder() to be on the safe side, but it's unnecessary because the
    // object is never recreated.
    return std::launder(reinterpret_cast<QLoggingCategory *>(defaultLoggingCategory));
}